

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::reallocate
          (array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute> *this,
          u32 new_size)

{
  SAttribute *pSVar1;
  ulong *puVar2;
  long lVar3;
  SAttribute *this_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  pSVar1 = this->data;
  lVar3 = (ulong)new_size * 0x20;
  puVar2 = (ulong *)operator_new__(lVar3 + 8);
  *puVar2 = (ulong)new_size;
  if (new_size != 0) {
    lVar5 = 0;
    this_00 = (SAttribute *)(puVar2 + 1);
    do {
      io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute::SAttribute(this_00);
      lVar5 = lVar5 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar5 != lVar3);
  }
  this->data = (SAttribute *)(puVar2 + 1);
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  uVar6 = 0;
  uVar4 = (ulong)new_size;
  if ((int)new_size < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
    io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute::operator=
              ((SAttribute *)((long)&(this->data->Name).array + uVar6),
               (SAttribute *)((long)&(pSVar1->Name).array + uVar6));
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pSVar1 != (SAttribute *)0x0) {
    lVar3._0_4_ = pSVar1[-1].Value.allocated;
    lVar3._4_4_ = pSVar1[-1].Value.used;
    if (lVar3 != 0) {
      lVar5 = lVar3 << 5;
      do {
        io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute::~SAttribute
                  ((SAttribute *)((long)&pSVar1[-1].Name.array + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != 0);
    }
    operator_delete__(&pSVar1[-1].Value.allocated,lVar3 << 5 | 8);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}